

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

type_conflict1 CLI::detail::checked_multiply<int>(int *a,int b)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = *a;
  if ((b != 0 && uVar1 != 0) && (b != 1 && uVar1 != 1)) {
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    uVar4 = -b;
    if (0 < b) {
      uVar4 = b;
    }
    if (b < 1 == 0 < (int)uVar1) {
      iVar3 = -0x80000000 / (int)uVar2;
      bVar5 = iVar3 != -uVar4 && SBORROW4(iVar3,-uVar4) == (int)(iVar3 + uVar4) < 0;
    }
    else {
      bVar5 = (uint)(0x7fffffff / (ulong)uVar2) < uVar4;
    }
    if (bVar5) {
      return false;
    }
  }
  *a = uVar1 * b;
  return true;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, bool>::type checked_multiply(T &a, T b) {
    if(a == 0 || b == 0 || a == 1 || b == 1) {
        a *= b;
        return true;
    }
    if(a == (std::numeric_limits<T>::min)() || b == (std::numeric_limits<T>::min)()) {
        return false;
    }
    if(overflowCheck(a, b)) {
        return false;
    }
    a *= b;
    return true;
}